

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::cursor_event(Application *this,float x,float y)

{
  if (this->leftDown == true) {
    if ((this->middleDown == false) && (this->rightDown == false)) {
      mouse1_dragged(this,x,y);
    }
  }
  else if ((this->middleDown == false) && (this->rightDown == true)) {
    mouse2_dragged(this,x,y);
  }
  else if ((this->leftDown == false) && ((this->middleDown == false && (this->rightDown == false))))
  {
    mouse_moved(this,x,y);
  }
  this->mouseX = x;
  this->mouseY = y;
  return;
}

Assistant:

void Application::cursor_event( float x, float y )
{
   if (leftDown && !middleDown && !rightDown) {
      mouse1_dragged(x, y);
   } else if (!leftDown && !middleDown && rightDown) {
      mouse2_dragged(x, y);
   } else if (!leftDown && !middleDown && !rightDown) {
      mouse_moved(x, y);
   }

   mouseX = x;
   mouseY = y;
}